

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deBool dVar6;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *log_00;
  NotSupportedError *this_01;
  char *str;
  PixelFormat *pPVar7;
  TestError *this_02;
  Context *local_6550;
  Context *local_6540;
  int local_64e8;
  int local_64e4;
  int ndx_1;
  int ndx;
  MultisamplePixelBufferAccess local_64b8;
  MultisamplePixelBufferAccess local_6490;
  ReferenceContextLimits local_6468;
  undefined1 local_6410 [8];
  ReferenceContext refContext;
  undefined1 local_250 [8];
  ReferenceContextBuffers refBuffers;
  undefined1 local_1c8 [8];
  GLContext gles3Context;
  int y;
  int x;
  int height;
  int width;
  Random rnd;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  TextureSpecCase *this_local;
  RenderTarget *this_00;
  
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*context->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar1 = tcu::RenderTarget::getWidth(this_00);
  if (0xff < iVar1) {
    iVar1 = tcu::RenderTarget::getHeight(this_00);
    if (0xff < iVar1) {
      str = tcu::TestNode::getName((TestNode *)this);
      dVar2 = deStringHash(str);
      de::Random::Random((Random *)&height,dVar2);
      iVar1 = tcu::RenderTarget::getWidth(this_00);
      iVar1 = ::deMin32(iVar1,0x100);
      iVar3 = tcu::RenderTarget::getHeight(this_00);
      iVar3 = ::deMin32(iVar3,0x100);
      iVar4 = tcu::RenderTarget::getWidth(this_00);
      iVar4 = de::Random::getInt((Random *)&height,0,iVar4 - iVar1);
      iVar5 = tcu::RenderTarget::getHeight(this_00);
      gles3Context.m_programs.
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           de::Random::getInt((Random *)&height,0,iVar5 - iVar3);
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)&refBuffers.m_stencilbuffer.m_data.m_cap,iVar4,
                 gles3Context.m_programs.
                 super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar1,iVar3);
      sglr::GLContext::GLContext
                ((GLContext *)local_1c8,context,log_00,1,
                 (IVec4 *)&refBuffers.m_stencilbuffer.m_data.m_cap);
      pPVar7 = tcu::RenderTarget::getPixelFormat(this_00);
      tcu::PixelFormat::PixelFormat
                ((PixelFormat *)
                 &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,8,8,8,
                 (uint)(pPVar7->alphaBits != 0) << 3);
      sglr::ReferenceContextBuffers::ReferenceContextBuffers
                ((ReferenceContextBuffers *)local_250,
                 (PixelFormat *)
                 &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,0,0,iVar1,iVar3,1);
      sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6468,context);
      sglr::ReferenceContextBuffers::getColorbuffer
                (&local_6490,(ReferenceContextBuffers *)local_250);
      sglr::ReferenceContextBuffers::getDepthbuffer
                (&local_64b8,(ReferenceContextBuffers *)local_250);
      sglr::ReferenceContextBuffers::getStencilbuffer
                ((MultisamplePixelBufferAccess *)&ndx_1,(ReferenceContextBuffers *)local_250);
      sglr::ReferenceContext::ReferenceContext
                ((ReferenceContext *)local_6410,&local_6468,&local_6490,&local_64b8,
                 (MultisamplePixelBufferAccess *)&ndx_1);
      sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6468);
      for (local_64e4 = 0; local_64e4 < 2; local_64e4 = local_64e4 + 1) {
        if (local_64e4 == 0) {
          local_6540 = (Context *)local_1c8;
        }
        else {
          local_6540 = (Context *)local_6410;
        }
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6540);
        sglr::ContextWrapper::glClearColor(&this->super_ContextWrapper,0.125,0.25,0.5,1.0);
        sglr::ContextWrapper::glClear(&this->super_ContextWrapper,0x4500);
      }
      local_64e8 = 0;
      do {
        if (1 < local_64e8) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          sglr::GLContext::enableLogging((GLContext *)local_1c8,0);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                    (this,local_1c8,local_6410);
          sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6410);
          sglr::ReferenceContextBuffers::~ReferenceContextBuffers
                    ((ReferenceContextBuffers *)local_250);
          sglr::GLContext::~GLContext((GLContext *)local_1c8);
          de::Random::~Random((Random *)&height);
          return STOP;
        }
        if (local_64e8 == 0) {
          local_6550 = (Context *)local_1c8;
        }
        else {
          local_6550 = (Context *)local_6410;
        }
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6550);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
        do {
          dVar6 = ::deGetFalse();
          if (dVar6 != 0) {
LAB_01c6b026:
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,(char *)0x0,"glGetError() == GL_NO_ERROR",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                       ,0xd6);
            __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar2 = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
          if (dVar2 != 0) goto LAB_01c6b026;
          dVar6 = ::deGetFalse();
        } while (dVar6 != 0);
        local_64e8 = local_64e8 + 1;
      } while( true );
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0xbb);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	if (renderTarget.getWidth() < VIEWPORT_WIDTH || renderTarget.getHeight() < VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES3
	de::Random		rnd			(deStringHash(getName()));
	int				width		= deMin32(renderTarget.getWidth(),	VIEWPORT_WIDTH);
	int				height		= deMin32(renderTarget.getHeight(),	VIEWPORT_HEIGHT);
	int				x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int				y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles3Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles3Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES3 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles3Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles3Context.enableLogging(0);

	// Verify results.
	verifyTexture(gles3Context, refContext);

	return STOP;
}